

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

gint tb_tc_cmp(gconstpointer ap,gconstpointer bp)

{
  long lVar1;
  ulong uVar2;
  gint gVar3;
  ulong uVar4;
  tb_tc *b;
  tb_tc *a;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  lVar1 = *(long *)((long)ap + 8);
  if (lVar1 != 0) {
    if (*(long *)((long)bp + 8) != 0) {
      uVar2 = *bp;
      gVar3 = 1;
      uVar4 = *ap;
      if (((uVar2 > uVar4 || uVar4 == uVar2) && (gVar3 = -1, uVar2 <= uVar4)) &&
         (gVar3 = 0, lVar1 != *(long *)((long)bp + 8))) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                   ,0x144,"a->size == b->size");
      }
      return gVar3;
    }
    if (lVar1 != 0) {
      uVar2 = *bp;
      uVar4 = lVar1 + *ap;
      bVar5 = uVar2 < *ap;
      bVar6 = uVar4 < uVar2;
      bVar7 = uVar4 == uVar2;
      goto LAB_00d09e9f;
    }
  }
  uVar2 = *ap;
  uVar4 = *(long *)((long)bp + 8) + *bp;
  bVar5 = uVar2 < *bp;
  bVar6 = uVar4 < uVar2;
  bVar7 = uVar4 == uVar2;
LAB_00d09e9f:
  gVar3 = 1;
  if (!bVar6 && !bVar7) {
    gVar3 = -(uint)bVar5;
  }
  return gVar3;
}

Assistant:

static gint tb_tc_cmp(gconstpointer ap, gconstpointer bp)
{
    const struct tb_tc *a = ap;
    const struct tb_tc *b = bp;

    /*
     * When both sizes are set, we know this isn't a lookup.
     * This is the most likely case: every TB must be inserted; lookups
     * are a lot less frequent.
     */
    if (likely(a->size && b->size)) {
        if (a->ptr > b->ptr) {
            return 1;
        } else if (a->ptr < b->ptr) {
            return -1;
        }
        /* a->ptr == b->ptr should happen only on deletions */
        g_assert(a->size == b->size);
        return 0;
    }
    /*
     * All lookups have either .size field set to 0.
     * From the glib sources we see that @ap is always the lookup key. However
     * the docs provide no guarantee, so we just mark this case as likely.
     */
    if (likely(a->size == 0)) {
        return ptr_cmp_tb_tc(a->ptr, b);
    }
    return ptr_cmp_tb_tc(b->ptr, a);
}